

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entenc.c
# Opt level: O2

void od_ec_encode_cdf_q15(od_ec_enc *enc,int s,uint16_t *icdf,int nsyms)

{
  int iVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  
  if (s < 1) {
    uVar4 = 0x8000;
  }
  else {
    uVar4 = (uint)icdf[(ulong)(uint)s - 1];
  }
  uVar2 = enc->rng;
  uVar3 = (uint)(uVar2 >> 8);
  if (uVar4 < 0x8000) {
    iVar1 = ((uVar4 >> 6) * uVar3 >> 1) + (nsyms - s) * 4;
    od_ec_enc_normalize(enc,enc->low + (ulong)((uint)uVar2 - iVar1),
                        ((s - (nsyms + -1)) * 4 - ((icdf[s] >> 6) * uVar3 >> 1)) + iVar1);
    return;
  }
  od_ec_enc_normalize(enc,enc->low,
                      ((uint)uVar2 + (s - (nsyms + -1)) * 4) - (uVar3 * (icdf[s] >> 6) >> 1));
  return;
}

Assistant:

void od_ec_encode_cdf_q15(od_ec_enc *enc, int s, const uint16_t *icdf,
                          int nsyms) {
  (void)nsyms;
  assert(s >= 0);
  assert(s < nsyms);
  assert(icdf[nsyms - 1] == OD_ICDF(CDF_PROB_TOP));
  od_ec_encode_q15(enc, s > 0 ? icdf[s - 1] : OD_ICDF(0), icdf[s], s, nsyms);
}